

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O2

void kokkosp_begin_deep_copy
               (SpaceHandle dst_handle,char *dst_name,void *dst_ptr,SpaceHandle src_handle,
               char *src_name,void *src_ptr,uint64_t size)

{
  uint64_t local_e0;
  void *local_d8;
  char *local_d0;
  void *local_c8;
  char *local_c0;
  char local_b8 [8];
  char acStack_b0 [8];
  char local_a8 [8];
  char acStack_a0 [8];
  char local_98 [8];
  char acStack_90 [8];
  char local_88 [8];
  char acStack_80 [8];
  char local_78 [8];
  char acStack_70 [8];
  char local_68 [8];
  char acStack_60 [8];
  char local_58 [8];
  char acStack_50 [8];
  char local_48 [8];
  char acStack_40 [8];
  char **local_38;
  char **local_30;
  uint64_t *local_28;
  char *local_20;
  char *local_18;
  void **local_10;
  void **local_8;
  
  local_88[0] = dst_handle.name[0x30];
  local_88[1] = dst_handle.name[0x31];
  local_88[2] = dst_handle.name[0x32];
  local_88[3] = dst_handle.name[0x33];
  local_88[4] = dst_handle.name[0x34];
  local_88[5] = dst_handle.name[0x35];
  local_88[6] = dst_handle.name[0x36];
  local_88[7] = dst_handle.name[0x37];
  acStack_80[0] = dst_handle.name[0x38];
  acStack_80[1] = dst_handle.name[0x39];
  acStack_80[2] = dst_handle.name[0x3a];
  acStack_80[3] = dst_handle.name[0x3b];
  acStack_80[4] = dst_handle.name[0x3c];
  acStack_80[5] = dst_handle.name[0x3d];
  acStack_80[6] = dst_handle.name[0x3e];
  acStack_80[7] = dst_handle.name[0x3f];
  local_98[0] = dst_handle.name[0x20];
  local_98[1] = dst_handle.name[0x21];
  local_98[2] = dst_handle.name[0x22];
  local_98[3] = dst_handle.name[0x23];
  local_98[4] = dst_handle.name[0x24];
  local_98[5] = dst_handle.name[0x25];
  local_98[6] = dst_handle.name[0x26];
  local_98[7] = dst_handle.name[0x27];
  acStack_90[0] = dst_handle.name[0x28];
  acStack_90[1] = dst_handle.name[0x29];
  acStack_90[2] = dst_handle.name[0x2a];
  acStack_90[3] = dst_handle.name[0x2b];
  acStack_90[4] = dst_handle.name[0x2c];
  acStack_90[5] = dst_handle.name[0x2d];
  acStack_90[6] = dst_handle.name[0x2e];
  acStack_90[7] = dst_handle.name[0x2f];
  local_a8[0] = dst_handle.name[0x10];
  local_a8[1] = dst_handle.name[0x11];
  local_a8[2] = dst_handle.name[0x12];
  local_a8[3] = dst_handle.name[0x13];
  local_a8[4] = dst_handle.name[0x14];
  local_a8[5] = dst_handle.name[0x15];
  local_a8[6] = dst_handle.name[0x16];
  local_a8[7] = dst_handle.name[0x17];
  acStack_a0[0] = dst_handle.name[0x18];
  acStack_a0[1] = dst_handle.name[0x19];
  acStack_a0[2] = dst_handle.name[0x1a];
  acStack_a0[3] = dst_handle.name[0x1b];
  acStack_a0[4] = dst_handle.name[0x1c];
  acStack_a0[5] = dst_handle.name[0x1d];
  acStack_a0[6] = dst_handle.name[0x1e];
  acStack_a0[7] = dst_handle.name[0x1f];
  local_b8[0] = dst_handle.name[0];
  local_b8[1] = dst_handle.name[1];
  local_b8[2] = dst_handle.name[2];
  local_b8[3] = dst_handle.name[3];
  local_b8[4] = dst_handle.name[4];
  local_b8[5] = dst_handle.name[5];
  local_b8[6] = dst_handle.name[6];
  local_b8[7] = dst_handle.name[7];
  acStack_b0[0] = dst_handle.name[8];
  acStack_b0[1] = dst_handle.name[9];
  acStack_b0[2] = dst_handle.name[10];
  acStack_b0[3] = dst_handle.name[0xb];
  acStack_b0[4] = dst_handle.name[0xc];
  acStack_b0[5] = dst_handle.name[0xd];
  acStack_b0[6] = dst_handle.name[0xe];
  acStack_b0[7] = dst_handle.name[0xf];
  local_48[0] = src_handle.name[0x30];
  local_48[1] = src_handle.name[0x31];
  local_48[2] = src_handle.name[0x32];
  local_48[3] = src_handle.name[0x33];
  local_48[4] = src_handle.name[0x34];
  local_48[5] = src_handle.name[0x35];
  local_48[6] = src_handle.name[0x36];
  local_48[7] = src_handle.name[0x37];
  acStack_40[0] = src_handle.name[0x38];
  acStack_40[1] = src_handle.name[0x39];
  acStack_40[2] = src_handle.name[0x3a];
  acStack_40[3] = src_handle.name[0x3b];
  acStack_40[4] = src_handle.name[0x3c];
  acStack_40[5] = src_handle.name[0x3d];
  acStack_40[6] = src_handle.name[0x3e];
  acStack_40[7] = src_handle.name[0x3f];
  local_58[0] = src_handle.name[0x20];
  local_58[1] = src_handle.name[0x21];
  local_58[2] = src_handle.name[0x22];
  local_58[3] = src_handle.name[0x23];
  local_58[4] = src_handle.name[0x24];
  local_58[5] = src_handle.name[0x25];
  local_58[6] = src_handle.name[0x26];
  local_58[7] = src_handle.name[0x27];
  acStack_50[0] = src_handle.name[0x28];
  acStack_50[1] = src_handle.name[0x29];
  acStack_50[2] = src_handle.name[0x2a];
  acStack_50[3] = src_handle.name[0x2b];
  acStack_50[4] = src_handle.name[0x2c];
  acStack_50[5] = src_handle.name[0x2d];
  acStack_50[6] = src_handle.name[0x2e];
  acStack_50[7] = src_handle.name[0x2f];
  local_68[0] = src_handle.name[0x10];
  local_68[1] = src_handle.name[0x11];
  local_68[2] = src_handle.name[0x12];
  local_68[3] = src_handle.name[0x13];
  local_68[4] = src_handle.name[0x14];
  local_68[5] = src_handle.name[0x15];
  local_68[6] = src_handle.name[0x16];
  local_68[7] = src_handle.name[0x17];
  acStack_60[0] = src_handle.name[0x18];
  acStack_60[1] = src_handle.name[0x19];
  acStack_60[2] = src_handle.name[0x1a];
  acStack_60[3] = src_handle.name[0x1b];
  acStack_60[4] = src_handle.name[0x1c];
  acStack_60[5] = src_handle.name[0x1d];
  acStack_60[6] = src_handle.name[0x1e];
  acStack_60[7] = src_handle.name[0x1f];
  local_78[0] = src_handle.name[0];
  local_78[1] = src_handle.name[1];
  local_78[2] = src_handle.name[2];
  local_78[3] = src_handle.name[3];
  local_78[4] = src_handle.name[4];
  local_78[5] = src_handle.name[5];
  local_78[6] = src_handle.name[6];
  local_78[7] = src_handle.name[7];
  acStack_70[0] = src_handle.name[8];
  acStack_70[1] = src_handle.name[9];
  acStack_70[2] = src_handle.name[10];
  acStack_70[3] = src_handle.name[0xb];
  acStack_70[4] = src_handle.name[0xc];
  acStack_70[5] = src_handle.name[0xd];
  acStack_70[6] = src_handle.name[0xe];
  acStack_70[7] = src_handle.name[0xf];
  if (DAT_0041c52d != 0) {
    local_38 = &local_c0;
    local_30 = &local_d0;
    local_28 = &local_e0;
    local_20 = local_b8;
    local_18 = local_78;
    local_10 = &local_c8;
    local_8 = &local_d8;
    local_e0 = size;
    local_d8 = src_ptr;
    local_d0 = src_name;
    local_c8 = dst_ptr;
    local_c0 = dst_name;
    perfetto::internal::
    TrackEventDataSource<perfetto::TrackEvent,&perfetto::internal::kCategoryRegistry>::operator()
              ((uint)DAT_0041c52d,(unsigned_long *)&local_38,(void **)src_name,(Type)src_ptr,
               (anon_class_56_7_af1e77c7 *)size);
  }
  return;
}

Assistant:

void kokkosp_begin_deep_copy(SpaceHandle dst_handle, const char *dst_name,
                             const void *dst_ptr, SpaceHandle src_handle,
                             const char *src_name, const void *src_ptr,
                             uint64_t size) {
  TRACE_EVENT_BEGIN("kokkos.deep_copy", nullptr,
                    [&](perfetto::EventContext ctx) {
                      std::stringstream _name;
                      _name << dst_name << "->" << src_name;
                      ctx.event()->set_name(_name.str());
                      add_annotation(ctx, "size", size);
                      add_annotation(ctx, "dest_type", dst_handle.name);
                      add_annotation(ctx, "src_type", src_handle.name);
                      add_annotation(ctx, "dest_address", dst_ptr);
                      add_annotation(ctx, "src_address", src_ptr);
                    });
}